

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitStringSliceWTF
          (PrintExpressionContents *this,StringSliceWTF *curr)

{
  long lVar1;
  ostream *stream;
  char *pcVar2;
  
  if (curr->op == StringSliceWTF16) {
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "stringview_wtf16.slice";
    lVar1 = 0x16;
  }
  else {
    if (curr->op != StringSliceWTF8) {
      handle_unreachable("invalid string.slice*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0x9d9);
    }
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "stringview_wtf8.slice";
    lVar1 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  Colors::outputColorCode(stream,"\x1b[0m");
  return;
}

Assistant:

void visitStringSliceWTF(StringSliceWTF* curr) {
    switch (curr->op) {
      case StringSliceWTF8:
        printMedium(o, "stringview_wtf8.slice");
        break;
      case StringSliceWTF16:
        printMedium(o, "stringview_wtf16.slice");
        break;
      default:
        WASM_UNREACHABLE("invalid string.slice*");
    }
  }